

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::UpdateImpl(cmCTestSVN *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *command;
  pointer pbVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> svn_update;
  OutputLogger err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  UpdateParser out;
  string local_1d8;
  undefined1 local_1b0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  string local_158;
  undefined1 local_138 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [13];
  char *local_38;
  
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  pcVar1 = local_138 + 0x10;
  local_138._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_158,pcVar2,(string *)local_138);
  command = extraout_RDX;
  if ((pointer)local_138._0_8_ != pcVar1) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    command = extraout_RDX_00;
  }
  if (local_158._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"SVNUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_138,pcVar2,(string *)local_1b0);
    std::__cxx11::string::operator=((string *)&local_158,(string *)local_138);
    command = extraout_RDX_01;
    if ((pointer)local_138._0_8_ != pcVar1) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      command = extraout_RDX_02;
    }
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      command = extraout_RDX_03;
    }
  }
  cmSystemTools::ParseArguments_abi_cxx11_
            (&local_170,(cmSystemTools *)local_158._M_dataplus._M_p,command);
  if (((this->super_cmCTestGlobalVC).super_cmCTestVC.CTest)->TestModel == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_(&local_1d8,(cmCTestVC *)this);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x591527);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_1b0._16_8_ = *psVar5;
      local_1b0._24_8_ = plVar4[3];
      local_1b0._0_8_ = local_1b0 + 0x10;
    }
    else {
      local_1b0._16_8_ = *psVar5;
      local_1b0._0_8_ = (size_type *)*plVar4;
    }
    local_1b0._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_1b0);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_138._16_8_ = *psVar5;
      local_138._24_8_ = plVar4[3];
      local_138._0_8_ = pcVar1;
    }
    else {
      local_138._16_8_ = *psVar5;
      local_138._0_8_ = (size_type *)*plVar4;
    }
    local_138._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    if ((pointer)local_138._0_8_ != pcVar1) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_138._0_8_ = "update";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(iterator)0x0,
             (char **)local_138);
  if (local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar6 = local_170.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_138._0_8_ = (pbVar6->_M_dataplus)._M_p;
      if (local_1d8._M_string_length == local_1d8.field_2._M_allocated_capacity) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,
                   (iterator)local_1d8._M_string_length,(char **)local_138);
      }
      else {
        *(undefined8 *)local_1d8._M_string_length = local_138._0_8_;
        local_1d8._M_string_length = local_1d8._M_string_length + 8;
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_170.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  UpdateParser::UpdateParser((UpdateParser *)local_138,this,"up-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_1b0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"up-err> ")
  ;
  bVar3 = RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8,
                        (OutputParser *)local_138,(OutputParser *)local_1b0);
  local_1b0._0_8_ = &PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._24_8_ != &local_188) {
    operator_delete((void *)local_1b0._24_8_,local_188._M_allocated_capacity + 1);
  }
  local_138._0_8_ = &PTR__UpdateParser_006ba988;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  local_138._0_8_ = &PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._24_8_ != local_110) {
    operator_delete((void *)local_138._24_8_,local_110[0]._M_allocated_capacity + 1);
  }
  if (local_1d8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    local_1d8.field_2._M_allocated_capacity - (long)local_1d8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestSVN::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if(opts.empty())
    {
    opts = this->CTest->GetCTestConfiguration("SVNUpdateOptions");
    }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());

  // Specify the start time for nightly testing.
  if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)
    {
    args.push_back("-r{" + this->GetNightlyTime() + " +0000}");
    }

  std::vector<char const*> svn_update;
  svn_update.push_back("update");
  for(std::vector<std::string>::const_iterator ai = args.begin();
      ai != args.end(); ++ai)
    {
    svn_update.push_back(ai->c_str());
    }

  UpdateParser out(this, "up-out> ");
  OutputLogger err(this->Log, "up-err> ");
  return this->RunSVNCommand(svn_update, &out, &err);
}